

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedSwitchBuffers::Run(AdvancedSwitchBuffers *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  byte bVar7;
  float data [32];
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  vec3 local_c8;
  vec3 local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [7];
  
  bVar7 = 0;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  lVar6 = 0x10;
  if (bVar1) {
    local_a8._0_8_ = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,
               "\nstruct VertexData {\n  vec2 position;\n  vec3 color;\n};\nlayout(binding = 0, std430) buffer Input {\n  VertexData vertex[];\n} g_vs_in;\nout StageData {\n  vec3 color;\n} g_vs_out;\nvoid main() {\n  gl_Position = vec4(g_vs_in.vertex[gl_VertexID].position, 0, 1);\n  g_vs_out.color = g_vs_in.vertex[gl_VertexID].color;\n}"
               ,"");
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,
               "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(g_fs_in.color, 1);\n}"
               ,"");
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)local_a8,
                       (string *)local_e8);
    this->m_program = GVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0]._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar6 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,5,this->m_storage_buffer);
      puVar4 = &DAT_01a46250;
      puVar5 = (undefined8 *)local_a8;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_a8,0x88e4);
      puVar4 = &DAT_01a462d0;
      puVar5 = (undefined8 *)local_a8;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_a8,0x88e4);
      puVar4 = &DAT_01a46350;
      puVar5 = (undefined8 *)local_a8;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_a8,0x88e4);
      puVar4 = &DAT_01a463d0;
      puVar5 = (undefined8 *)local_a8;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,local_a8,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x200,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f36,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glCopyBufferSubData(this_00,0x8f36,0x90d2,0,0,0x80);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f36,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glCopyBufferSubData(this_00,0x8f36,0x90d2,0,0x80,0x80);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f36,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glCopyBufferSubData(this_00,0x8f36,0x90d2,0,0x100,0x80);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f36,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glCopyBufferSubData(this_00,0x8f36,0x90d2,0,0x180,0x80);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      lVar3 = 0xb;
      do {
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[lVar3 + -0xb])
        ;
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xf);
      local_a8._0_8_ = (pointer)0x3f800000;
      local_a8._8_4_ = 0.0;
      local_e8._0_8_ = (pointer)0x3f80000000000000;
      local_e8._8_4_ = 0.0;
      local_b8.m_data[0] = 1.0;
      local_b8.m_data[1] = 1.0;
      local_b8.m_data[2] = 0.0;
      local_c8.m_data[0] = 0.0;
      local_c8.m_data[1] = 0.0;
      local_c8.m_data[2] = 1.0;
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_a8,
                         (vec3 *)local_e8,&local_b8,&local_c8,(int *)0x0);
      if (bVar1) {
        glu::CallLogWrapper::glClear(this_00,0x4000);
        lVar6 = 0;
        do {
          glu::CallLogWrapper::glBindBufferRange
                    (this_00,0x90d2,0,this->m_storage_buffer[4],lVar6,0x80);
          glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
          lVar6 = lVar6 + 0x80;
        } while (lVar6 != 0x200);
        local_a8._0_8_ = (pointer)0x3f800000;
        local_a8._8_4_ = 0.0;
        local_e8._0_8_ = (pointer)0x3f80000000000000;
        local_e8._8_4_ = 0.0;
        local_b8.m_data[0] = 1.0;
        local_b8.m_data[1] = 1.0;
        local_b8.m_data[2] = 0.0;
        local_c8.m_data[0] = 0.0;
        local_c8.m_data[1] = 0.0;
        local_c8.m_data[2] = 1.0;
        bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_a8,
                           (vec3 *)local_e8,&local_b8,&local_c8,(int *)0x0);
        lVar6 = (ulong)bVar1 - 1;
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "struct VertexData {" NL "  vec2 position;" NL "  vec3 color;" NL "};" NL
			   "layout(binding = 0, std430) buffer Input {" NL "  VertexData vertex[];" NL "} g_vs_in;" NL
			   "out StageData {" NL "  vec3 color;" NL "} g_vs_out;" NL "void main() {" NL
			   "  gl_Position = vec4(g_vs_in.vertex[gl_VertexID].position, 0, 1);" NL
			   "  g_vs_out.color = g_vs_in.vertex[gl_VertexID].color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			   "void main() {" NL "  g_fs_out = vec4(g_fs_in.color, 1);" NL "}";
		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(5, m_storage_buffer);

		/* left, bottom, red quad */
		{
			const float data[] = { -0.4f - 0.5f, -0.4f - 0.5f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f,
								   0.4f - 0.5f,  -0.4f - 0.5f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f,
								   -0.4f - 0.5f, 0.4f - 0.5f,  0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f,
								   0.4f - 0.5f,  0.4f - 0.5f,  0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* right, bottom, green quad */
		{
			const float data[] = { -0.4f + 0.5f, -0.4f - 0.5f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  -0.4f - 0.5f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f,
								   -0.4f + 0.5f, 0.4f - 0.5f,  0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  0.4f - 0.5f,  0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 0.0f };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* left, top, blue quad */
		{
			const float data[] = { -0.4f - 0.5f, -0.4f + 0.5f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f,
								   0.4f - 0.5f,  -0.4f + 0.5f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f,
								   -0.4f - 0.5f, 0.4f + 0.5f,  0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f,
								   0.4f - 0.5f,  0.4f + 0.5f,  0.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* right, top, yellow quad */
		{
			const float data[] = { -0.4f + 0.5f, -0.4f + 0.5f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  -0.4f + 0.5f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f,
								   -0.4f + 0.5f, 0.4f + 0.5f,  0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f,
								   0.4f + 0.5f,  0.4f + 0.5f,  0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.0f };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(float) * 32 * 4, NULL, GL_STATIC_DRAW);

		glBindBuffer(GL_COPY_READ_BUFFER, m_storage_buffer[0]);
		glCopyBufferSubData(GL_COPY_READ_BUFFER, GL_SHADER_STORAGE_BUFFER, 0, 0, sizeof(float) * 32);
		glBindBuffer(GL_COPY_READ_BUFFER, m_storage_buffer[1]);
		glCopyBufferSubData(GL_COPY_READ_BUFFER, GL_SHADER_STORAGE_BUFFER, 0, sizeof(float) * 32, sizeof(float) * 32);
		glBindBuffer(GL_COPY_READ_BUFFER, m_storage_buffer[2]);
		glCopyBufferSubData(GL_COPY_READ_BUFFER, GL_SHADER_STORAGE_BUFFER, 0, 2 * sizeof(float) * 32,
							sizeof(float) * 32);
		glBindBuffer(GL_COPY_READ_BUFFER, m_storage_buffer[3]);
		glCopyBufferSubData(GL_COPY_READ_BUFFER, GL_SHADER_STORAGE_BUFFER, 0, 3 * sizeof(float) * 32,
							sizeof(float) * 32);

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);

		glClear(GL_COLOR_BUFFER_BIT);
		for (int i = 0; i < 4; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[i]);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		}
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		for (int i = 0; i < 4; ++i)
		{
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[4], i * sizeof(float) * 32,
							  sizeof(float) * 32);
			glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);
		}
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}